

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O3

REF_STATUS ref_migrate_create(REF_MIGRATE *ref_migrate_ptr,REF_GRID ref_grid)

{
  size_t __size;
  REF_INT reference;
  REF_NODE ref_node;
  REF_DBL *pRVar1;
  REF_CELL pRVar2;
  uint uVar3;
  int iVar4;
  REF_MIGRATE pRVar5;
  REF_GLOB *__s;
  REF_DBL *pRVar6;
  REF_INT *vector;
  undefined8 uVar7;
  REF_INT RVar8;
  REF_ADJ *ref_adj_ptr;
  long lVar9;
  REF_STATUS RVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  char *pcVar15;
  REF_CELL *ppRVar16;
  
  ref_node = ref_grid->node;
  pRVar5 = (REF_MIGRATE)malloc(0x48);
  *ref_migrate_ptr = pRVar5;
  if (pRVar5 == (REF_MIGRATE)0x0) {
    pcVar15 = "malloc *ref_migrate_ptr of REF_MIGRATE_STRUCT NULL";
    uVar7 = 0x43;
LAB_0020f956:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",uVar7
           ,"ref_migrate_create",pcVar15);
    RVar10 = 2;
  }
  else {
    pRVar5->grid = ref_grid;
    uVar3 = ref_adj_create(&pRVar5->parent_local);
    if (uVar3 == 0) {
      uVar3 = ref_adj_create(&pRVar5->parent_part);
      if (uVar3 == 0) {
        ref_adj_ptr = &pRVar5->conn;
        uVar3 = ref_adj_create(ref_adj_ptr);
        if (uVar3 == 0) {
          uVar3 = ref_node->max;
          uVar11 = (ulong)uVar3;
          pRVar5->max = uVar3;
          if ((int)uVar3 < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                   ,0x50,"ref_migrate_create","malloc ref_migrate->global of REF_GLOB negative");
            return 1;
          }
          __size = uVar11 * 8;
          __s = (REF_GLOB *)malloc(__size);
          pRVar5->global = __s;
          if (__s == (REF_GLOB *)0x0) {
            pcVar15 = "malloc ref_migrate->global of REF_GLOB NULL";
            uVar7 = 0x50;
          }
          else {
            if (uVar3 != 0) {
              memset(__s,0xff,__size);
            }
            pRVar6 = (REF_DBL *)malloc(uVar11 * 0x18);
            pRVar5->xyz = pRVar6;
            if (pRVar6 == (REF_DBL *)0x0) {
              pcVar15 = "malloc ref_migrate->xyz of REF_DBL NULL";
              uVar7 = 0x51;
            }
            else {
              pRVar6 = (REF_DBL *)malloc(__size);
              pRVar5->weight = pRVar6;
              if (pRVar6 == (REF_DBL *)0x0) {
                pcVar15 = "malloc ref_migrate->weight of REF_DBL NULL";
                uVar7 = 0x52;
              }
              else {
                vector = (REF_INT *)malloc(uVar11 * 4);
                pRVar5->age = vector;
                if (vector != (REF_INT *)0x0) {
                  if (uVar3 != 0) {
                    lVar13 = 2;
                    lVar9 = 0;
                    lVar14 = 2;
                    do {
                      if ((-1 < ref_node->global[lVar9]) &&
                         (ref_node->ref_mpi->id == ref_node->part[lVar9])) {
                        pRVar5->global[lVar9] = ref_node->global[lVar9];
                        RVar8 = (REF_INT)lVar9;
                        uVar3 = ref_adj_add(pRVar5->parent_local,RVar8,RVar8);
                        if (uVar3 != 0) {
                          uVar11 = (ulong)uVar3;
                          pcVar15 = "add";
                          uVar7 = 0x59;
                          goto LAB_0020f9d0;
                        }
                        uVar3 = ref_adj_add(pRVar5->parent_part,RVar8,ref_node->part[lVar9]);
                        if (uVar3 != 0) {
                          uVar11 = (ulong)uVar3;
                          pcVar15 = "add";
                          uVar7 = 0x5c;
                          goto LAB_0020f9d0;
                        }
                        pRVar6 = ref_node->real;
                        pRVar1 = pRVar5->xyz;
                        pRVar1[lVar14 + -2] = pRVar6[lVar13 + -2];
                        pRVar1[lVar14 + -1] = pRVar6[lVar13 + -1];
                        pRVar1[lVar14] = pRVar6[lVar13];
                        pRVar5->weight[lVar9] = 1.0;
                        vector = pRVar5->age;
                        vector[lVar9] = ref_node->age[lVar9];
                        uVar11 = (ulong)(uint)ref_node->max;
                      }
                      lVar9 = lVar9 + 1;
                      lVar14 = lVar14 + 3;
                      lVar13 = lVar13 + 0xf;
                    } while (lVar9 < (int)uVar11);
                  }
                  uVar3 = ref_node_ghost_int(ref_node,vector,1);
                  if (uVar3 == 0) {
                    ppRVar16 = ref_grid->cell + 3;
                    lVar9 = 3;
                    do {
                      pRVar2 = *ppRVar16;
                      iVar4 = pRVar2->max;
                      if (0 < iVar4) {
                        iVar12 = 0;
                        do {
                          if ((pRVar2->c2n[(long)pRVar2->size_per * (long)iVar12] != -1) &&
                             (0 < pRVar2->edge_per)) {
                            lVar13 = 0;
                            do {
                              lVar14 = (long)pRVar2->size_per * (long)iVar12;
                              RVar8 = pRVar2->c2n[pRVar2->e2n[lVar13 * 2] + lVar14];
                              reference = pRVar2->c2n
                                          [(long)(int)lVar14 + (long)pRVar2->e2n[lVar13 * 2 + 1]];
                              uVar3 = ref_adj_add_uniquely(*ref_adj_ptr,RVar8,reference);
                              if (uVar3 != 0) {
                                uVar11 = (ulong)uVar3;
                                pcVar15 = "uniq";
                                uVar7 = 0x6f;
                                goto LAB_0020f9d0;
                              }
                              uVar3 = ref_adj_add_uniquely(*ref_adj_ptr,reference,RVar8);
                              if (uVar3 != 0) {
                                uVar11 = (ulong)uVar3;
                                pcVar15 = "uniq";
                                uVar7 = 0x71;
                                goto LAB_0020f9d0;
                              }
                              lVar13 = lVar13 + 1;
                            } while (lVar13 < pRVar2->edge_per);
                            iVar4 = pRVar2->max;
                          }
                          iVar12 = iVar12 + 1;
                        } while (iVar12 < iVar4);
                      }
                      ppRVar16 = ref_grid->cell + lVar9 + 1;
                      lVar9 = lVar9 + 1;
                      if (lVar9 == 0x10) {
                        return 0;
                      }
                    } while( true );
                  }
                  uVar11 = (ulong)uVar3;
                  pcVar15 = "ghost age for edge weights";
                  uVar7 = 0x65;
                  goto LAB_0020f9d0;
                }
                pcVar15 = "malloc ref_migrate->age of REF_INT NULL";
                uVar7 = 0x53;
              }
            }
          }
          goto LAB_0020f956;
        }
        uVar11 = (ulong)uVar3;
        pcVar15 = "make adj";
        uVar7 = 0x4b;
      }
      else {
        uVar11 = (ulong)uVar3;
        pcVar15 = "make adj";
        uVar7 = 0x4a;
      }
    }
    else {
      uVar11 = (ulong)uVar3;
      pcVar15 = "make adj";
      uVar7 = 0x49;
    }
LAB_0020f9d0:
    RVar10 = (REF_STATUS)uVar11;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",uVar7
           ,"ref_migrate_create",uVar11,pcVar15);
  }
  return RVar10;
}

Assistant:

REF_FCN REF_STATUS ref_migrate_create(REF_MIGRATE *ref_migrate_ptr,
                                      REF_GRID ref_grid) {
  REF_MIGRATE ref_migrate;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT node;
  REF_INT group, cell, cell_edge, n0, n1;

  ref_malloc(*ref_migrate_ptr, 1, REF_MIGRATE_STRUCT);

  ref_migrate = *ref_migrate_ptr;

  ref_migrate_grid(ref_migrate) = ref_grid;

  RSS(ref_adj_create(&(ref_migrate_parent_local(ref_migrate))), "make adj");
  RSS(ref_adj_create(&(ref_migrate_parent_part(ref_migrate))), "make adj");
  RSS(ref_adj_create(&(ref_migrate_conn(ref_migrate))), "make adj");

  ref_migrate_max(ref_migrate) = ref_node_max(ref_node);

  ref_malloc_init(ref_migrate->global, ref_migrate_max(ref_migrate), REF_GLOB,
                  REF_EMPTY);
  ref_malloc(ref_migrate->xyz, 3 * ref_migrate_max(ref_migrate), REF_DBL);
  ref_malloc(ref_migrate->weight, ref_migrate_max(ref_migrate), REF_DBL);
  ref_malloc(ref_migrate->age, ref_migrate_max(ref_migrate), REF_INT);

  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      ref_migrate_global(ref_migrate, node) = ref_node_global(ref_node, node);
      RSS(ref_adj_add(ref_migrate_parent_local(ref_migrate), node, node),
          "add");
      RSS(ref_adj_add(ref_migrate_parent_part(ref_migrate), node,
                      ref_node_part(ref_node, node)),
          "add");
      ref_migrate_xyz(ref_migrate, 0, node) = ref_node_xyz(ref_node, 0, node);
      ref_migrate_xyz(ref_migrate, 1, node) = ref_node_xyz(ref_node, 1, node);
      ref_migrate_xyz(ref_migrate, 2, node) = ref_node_xyz(ref_node, 2, node);
      ref_migrate_weight(ref_migrate, node) = 1.0;
      ref_migrate_age(ref_migrate, node) = ref_node_age(ref_node, node);
    }
  }
  RSS(ref_node_ghost_int(ref_node, (ref_migrate->age), 1),
      "ghost age for edge weights");

  /* 2d included for twod */
  each_ref_grid_2d_3d_ref_cell(ref_grid, group, ref_cell) {
    each_ref_cell_valid_cell(ref_cell, cell) {
      each_ref_cell_cell_edge(ref_cell, cell_edge) {
        /* need ghost nodes for agglomeration */
        n0 = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
        n1 = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
        RSS(ref_adj_add_uniquely(ref_migrate_conn(ref_migrate), n0, n1),
            "uniq");
        RSS(ref_adj_add_uniquely(ref_migrate_conn(ref_migrate), n1, n0),
            "uniq");
      }
    }
  }

  return REF_SUCCESS;
}